

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_sync.cpp
# Opt level: O3

bool __thiscall anon_unknown.dwarf_3c2cca::SyncFixture::is_found(SyncFixture *this,string *key)

{
  bool bVar1;
  hamt_map<std::__cxx11::string,pstore::extent<char>,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>>
  *local_28;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_20;
  
  pstore::index::
  get_index<(pstore::trailer::indices)5,pstore::database,pstore::index::hamt_map<std::__cxx11::string,pstore::extent<char>,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>>>
            ((index *)&local_28,&this->db_,true);
  bVar1 = pstore::index::
          hamt_map<std::__cxx11::string,pstore::extent<char>,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>>
          ::contains<std::__cxx11::string,void>(local_28,&this->db_,key);
  if (local_20 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_20);
  }
  return bVar1;
}

Assistant:

bool SyncFixture::is_found (std::string const & key) {
        return pstore::index::get_index<pstore::trailer::indices::write> (db_)->contains (db_, key);
    }